

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<void_(pstore::gsl::span<int,_-1L>)>::Matches
          (OnCallSpec<void_(pstore::gsl::span<int,__1L>)> *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<void_(pstore::gsl::span<int,__1L>)> *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<pstore::gsl::span<int,_1l>>>,std::tuple<pstore::gsl::span<int,_1l>>>
                    ((tuple<testing::Matcher<pstore::gsl::span<int,__1L>_>_> *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<pstore::gsl::span<int,_-1L>_>_&>::Matches
                         ((MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&> *)
                          (this + 0x28),args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }